

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_functions_to_test.hpp
# Opt level: O2

void duckdb::udf_max_flat<double>(DataChunk *args,ExpressionState *state,Vector *result)

{
  double *pdVar1;
  double dVar2;
  void *__s;
  long lVar3;
  ulong uVar4;
  reference pvVar5;
  ulong uVar6;
  idx_t col_idx;
  ulong __n;
  
  duckdb::DataChunk::Flatten();
  duckdb::Vector::SetVectorType((VectorType)result);
  __s = *(void **)(result + 0x20);
  memset(__s,0,*(long *)(args + 0x18) << 3);
  for (__n = 0; __n < (ulong)((*(long *)(args + 8) - *(long *)args) / 0x68); __n = __n + 1) {
    pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,__n);
    lVar3 = *(long *)(pvVar5 + 0x20);
    uVar4 = *(ulong *)(args + 0x18);
    for (uVar6 = 0; uVar6 < uVar4; uVar6 = uVar6 + 1) {
      dVar2 = *(double *)(lVar3 + uVar6 * 8);
      pdVar1 = (double *)((long)__s + uVar6 * 8);
      if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
        *(double *)((long)__s + uVar6 * 8) = dVar2;
      }
    }
  }
  return;
}

Assistant:

static void udf_max_flat(DataChunk &args, ExpressionState &state, Vector &result) {
	args.Flatten();
	D_ASSERT(TypeIsNumeric(GetTypeId<TYPE>()));

	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto result_data = FlatVector::GetData<TYPE>(result);

	// Initialize the result vector with the minimum value from TYPE.
	memset(result_data, std::numeric_limits<TYPE>::min(), args.size() * sizeof(TYPE));

	for (idx_t col_idx = 0; col_idx < args.ColumnCount(); col_idx++) {
		auto &input = args.data[col_idx];
		D_ASSERT((GetTypeId<TYPE>()) == input.GetType().InternalType());
		auto input_data = FlatVector::GetData<TYPE>(input);
		for (idx_t i = 0; i < args.size(); ++i) {
			if (result_data[i] < input_data[i]) {
				result_data[i] = input_data[i];
			}
		}
	}
}